

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.c
# Opt level: O2

HT_ErrorCode ht_timeline_set_feature(HT_Timeline *timeline,HT_Feature *feature)

{
  HT_FeatureKlass *pHVar1;
  HT_ErrorCode HVar2;
  uint __line;
  ulong uVar3;
  char *__assertion;
  
  if (feature == (HT_Feature *)0x0) {
    __assertion = "feature";
    __line = 0x7b;
  }
  else {
    pHVar1 = feature->klass;
    if (pHVar1 != (HT_FeatureKlass *)0x0) {
      uVar3 = (ulong)pHVar1->id;
      if (uVar3 < 0x20) {
        if (timeline->features[uVar3] == (HT_Feature *)0x0) {
          timeline->features[uVar3] = feature;
          return HT_ERR_OK;
        }
        HVar2 = HT_ERR_FEATURE_ALREADY_REGISTERED;
      }
      else {
        HVar2 = HT_ERR_FEATURE_NOT_REGISTERED;
      }
      (*pHVar1->destroy)(feature);
      return HVar2;
    }
    __assertion = "feature->klass";
    __line = 0x7c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/timeline.c"
                ,__line,"HT_ErrorCode ht_timeline_set_feature(HT_Timeline *, HT_Feature *)");
}

Assistant:

HT_ErrorCode
ht_timeline_set_feature(HT_Timeline* timeline, HT_Feature* feature)
{
    assert(feature);
    assert(feature->klass);

    HT_ErrorCode error_code = HT_ERR_OK;

    if (feature->klass->id == HT_INVALID_FEATURE_ID || feature->klass->id >= HT_TIMELINE_MAX_FEATURES)
    {
        error_code = HT_ERR_FEATURE_NOT_REGISTERED;
    }
    else if (timeline->features[feature->klass->id])
    {
        error_code = HT_ERR_FEATURE_ALREADY_REGISTERED;
    }
    else
    {
        timeline->features[feature->klass->id] = feature;
    }

    if (error_code != HT_ERR_OK)
    {
        feature->klass->destroy(feature);
    }

    return error_code;
}